

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestPipelineImpl::getCap(TestPipelineImpl *this,GetCapContext context)

{
  CapTableBuilder *pCVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  RequestHook *pRVar5;
  TransformPromiseNodeBase *this_00;
  size_t __n;
  Disposer *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  PromiseNode *pPVar6;
  int in_R8D;
  bool bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Promise<void> PVar12;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Reader params;
  undefined1 local_110 [16];
  undefined8 uStack_100;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_f8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_b8;
  StructReader local_78;
  Maybe<capnp::MessageSize> local_40;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**in_RDX->_vptr_Disposer)(&local_f8);
  local_b8.super_Builder._builder.segment._4_4_ = local_f8.super_Builder._builder.segment._4_4_;
  local_b8.super_Builder._builder.data = local_f8.super_Builder._builder.data;
  local_b8.super_Builder._builder.pointers = local_f8.super_Builder._builder.pointers;
  local_b8.super_Builder._builder.capTable = local_f8.super_Builder._builder.capTable;
  PointerReader::getStruct(&local_78,(PointerReader *)&local_b8,(word *)0x0);
  if (local_78.dataSize < 0x20) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_002508be;
    local_f8.super_Builder._builder.segment._0_4_ = 0;
  }
  else {
    if ((*local_78.data == 0xea) || (2 < kj::_::Debug::minSeverity)) goto LAB_002508be;
    local_f8.super_Builder._builder.segment._0_4_ = *local_78.data;
  }
  local_b8.super_Builder._builder.segment =
       (SegmentBuilder *)CONCAT44(local_b8.super_Builder._builder.segment._4_4_,0xea);
  in_R8D = 0x2da261;
  kj::_::Debug::log<char_const(&)[42],int,unsigned_int>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x3a8,ERROR,"\"failed: expected \" \"(234) == (params.getN())\", 234, params.getN()",
             (char (*) [42])"failed: expected (234) == (params.getN())",(int *)&local_b8,
             (uint *)&local_f8);
LAB_002508be:
  bVar7 = local_78.pointerCount != 0;
  local_b8.super_Builder._builder.data = (WirePointer *)0x0;
  if (bVar7) {
    local_b8.super_Builder._builder.data = local_78.pointers;
  }
  __n = 0x7fffffff;
  if (bVar7) {
    __n = (size_t)(uint)local_78.nestingLimit;
  }
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  if (bVar7) {
    uVar8 = local_78.segment._0_4_;
    uVar9 = local_78.segment._4_4_;
    uVar10 = local_78.capTable._0_4_;
    uVar11 = local_78.capTable._4_4_;
  }
  local_b8.super_Builder._builder.segment = (SegmentBuilder *)CONCAT44(uVar9,uVar8);
  local_b8.super_Builder._builder.capTable = (CapTableBuilder *)CONCAT44(uVar11,uVar10);
  local_b8.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_b8.super_Builder._builder.pointers._4_4_,(int)__n);
  PointerReader::getCapability((PointerReader *)&local_f8);
  local_110._8_4_ = (int)local_f8.super_Builder._builder.segment;
  local_110._12_4_ = local_f8.super_Builder._builder.segment._4_4_;
  uStack_100 = local_f8.super_Builder._builder.capTable;
  local_110._0_8_ = &Capability::Client::typeinfo;
  (*in_RDX->_vptr_Disposer[1])();
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_b8,(Client *)local_110,&local_40);
  ((WireValue<uint32_t> *)local_b8.super_Builder._builder.data)->value = 0x7b;
  *(byte *)((long)local_b8.super_Builder._builder.data + 4) =
       *(byte *)((long)local_b8.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_f8,(int)&local_b8,__buf,__n,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_f8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:946:7),_kj::_::PropagateException>
             ::anon_class_16_2_06e2585c_for_func::operator());
  pDVar4 = local_f8.hook.disposer;
  uVar3 = local_f8.super_Builder._builder._32_8_;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0036f120;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)context.hook;
  this_00[1].dependency.disposer = in_RDX;
  (this->super_Server)._vptr_Server =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestPipelineImpl::getCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,capnproto_test::capnp::test::TestPipeline::GetCapResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
  pPVar6 = extraout_RDX;
  if (local_f8.super_Builder._builder._32_8_ != 0) {
    local_f8.super_Builder._builder.dataSize = 0;
    local_f8.super_Builder._builder.pointerCount = 0;
    local_f8.super_Builder._builder._38_2_ = 0;
    local_f8.hook.disposer = (Disposer *)0x0;
    (**(local_f8.hook.ptr)->_vptr_RequestHook)(local_f8.hook.ptr,uVar3,8,pDVar4,pDVar4,0);
    pPVar6 = extraout_RDX_00;
  }
  pWVar2 = local_f8.super_Builder._builder.pointers;
  if (local_f8.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_f8.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_f8.super_Builder._builder.data)
              (local_f8.super_Builder._builder.data,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
    pPVar6 = extraout_RDX_01;
  }
  pCVar1 = local_f8.super_Builder._builder.capTable;
  if (local_f8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_f8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_f8.super_Builder._builder.segment._4_4_,
                         (int)local_f8.super_Builder._builder.segment))
              ((undefined8 *)
               CONCAT44(local_f8.super_Builder._builder.segment._4_4_,
                        (int)local_f8.super_Builder._builder.segment),
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar1->super_CapTableReader);
    pPVar6 = extraout_RDX_02;
  }
  pRVar5 = local_b8.hook.ptr;
  if (local_b8.hook.ptr != (RequestHook *)0x0) {
    local_b8.hook.ptr = (RequestHook *)0x0;
    (**(local_b8.hook.disposer)->_vptr_Disposer)
              (local_b8.hook.disposer,
               pRVar5->_vptr_RequestHook[-2] + (long)&pRVar5->_vptr_RequestHook);
    pPVar6 = extraout_RDX_03;
  }
  pCVar1 = uStack_100;
  if (uStack_100 != (CapTableBuilder *)0x0) {
    uStack_100 = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_110._12_4_,local_110._8_4_))
              ((undefined8 *)CONCAT44(local_110._12_4_,local_110._8_4_),
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar1->super_CapTableReader);
    pPVar6 = extraout_RDX_04;
  }
  PVar12.super_PromiseBase.node.ptr = pPVar6;
  PVar12.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar12.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestPipelineImpl::getCap(GetCapContext context) {
  ++callCount;

  auto params = context.getParams();
  EXPECT_EQ(234, params.getN());

  auto cap = params.getInCap();
  context.releaseParams();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  return request.send().then(
      [this,KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());

        auto result = context.getResults();
        result.setS("bar");
        result.initOutBox().setCap(kj::heap<TestExtendsImpl>(callCount));
      }